

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.c
# Opt level: O0

int set_io_flag(int socket_fd,int flag)

{
  uint uVar1;
  int iVar2;
  uint in_ESI;
  int in_EDI;
  int old_flags;
  undefined4 local_4;
  
  uVar1 = fcntl(in_EDI,3,0);
  if (uVar1 == 0xffffffff) {
    local_4 = -1;
  }
  else {
    iVar2 = fcntl(in_EDI,4,(ulong)(uVar1 | in_ESI));
    if (iVar2 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int set_io_flag(int socket_fd, int flag) {
	int old_flags;

	// Get the old flags, because we must bitwise-OR our flag to add it
	// fnctl takes as arguments:
	// 1. The file fd to modify
	// 2. The command (e.g. F_GETFL, F_SETFL, ...)
	// 3. Arguments to that command (variadic)
	// For F_GETFL, the arguments are ignored (that's why we pass 0)
	if ((old_flags = fcntl(socket_fd, F_GETFL, 0)) == -1) {
		return -1;
	}

	if (fcntl(socket_fd, F_SETFL, old_flags | flag)) {
		return -1;
	}

	return 0;
}